

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O1

void __thiscall sznet::net::TcpConnection::handleClose(TcpConnection *this)

{
  EventLoop *this_00;
  Channel *this_01;
  bool bVar1;
  LogStream *this_02;
  char **ppcVar2;
  char *pcVar3;
  SourceFile file;
  undefined1 local_fe8 [8];
  TcpConnectionPtr guardThis;
  char *local_38 [4];
  
  this_00 = this->m_loop;
  bVar1 = EventLoop::isInLoopThread(this_00);
  if (!bVar1) {
    EventLoop::abortNotInLoopThread(this_00);
  }
  if (g_logLevel < 1) {
    file._8_8_ = 0x11;
    file.m_data = "TcpConnection.cpp";
    Logger::Logger((Logger *)local_fe8,file,0x197,TRACE,"handleClose");
    if (5 < (uint)((int)local_38 - (int)local_38[0])) {
      builtin_strncpy(local_38[0],"fd = ",5);
      local_38[0] = local_38[0] + 5;
    }
    this_02 = LogStream::operator<<
                        ((LogStream *)&guardThis,
                         ((this->m_channel)._M_t.
                          super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
                          .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl)->m_fd);
    ppcVar2 = &(this_02->m_buffer).m_cur;
    pcVar3 = (this_02->m_buffer).m_cur;
    if (9 < (uint)((int)ppcVar2 - (int)pcVar3)) {
      builtin_strncpy(pcVar3," state = ",9);
      *ppcVar2 = *ppcVar2 + 9;
    }
    if ((ulong)this->m_state < 4) {
      pcVar3 = *(char **)(&DAT_00149b58 + (ulong)this->m_state * 8);
    }
    else {
      pcVar3 = "unknown state";
    }
    LogStream::operator<<(this_02,pcVar3);
    Logger::~Logger((Logger *)local_fe8);
  }
  if ((this->m_state & ~kConnecting) == kConnected) {
    this->m_state = kDisconnected;
    this_01 = (this->m_channel)._M_t.
              super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>.
              _M_t.
              super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
              .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl;
    this_01->m_events = 0;
    Channel::update(this_01);
    std::__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<sznet::net::TcpConnection,void>
              ((__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)local_fe8,
               (__weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
    if ((this->m_connectionCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->m_connectionCallback)._M_invoker)
                ((_Any_data *)&this->m_connectionCallback,
                 (shared_ptr<sznet::net::TcpConnection> *)local_fe8);
    }
    if ((this->m_closeCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->m_closeCallback)._M_invoker)
                ((_Any_data *)&this->m_closeCallback,
                 (shared_ptr<sznet::net::TcpConnection> *)local_fe8);
      if (guardThis.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   guardThis.
                   super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ;
      }
      return;
    }
    std::__throw_bad_function_call();
  }
  __assert_fail("m_state == kConnected || m_state == kDisconnecting",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
                ,0x198,"void sznet::net::TcpConnection::handleClose()");
}

Assistant:

void TcpConnection::handleClose()
{
	m_loop->assertInLoopThread();
	LOG_TRACE << "fd = " << m_channel->fd() << " state = " << stateToString();
	assert(m_state == kConnected || m_state == kDisconnecting);
	// we don't close fd, leave it to dtor, so we can find leaks easily.
	setState(kDisconnected);
	m_channel->disableAll();

	// ��ֹ��ǰ�ͷţ����ɲ���Ԥ��������
	TcpConnectionPtr guardThis(shared_from_this());
	if (m_connectionCallback)
	{
		m_connectionCallback(guardThis);
	}
	// must be the last line
	m_closeCallback(guardThis);
}